

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCubeArray::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCubeArray *this,int level,int layer)

{
  TextureFormat *pTVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  PixelBufferAccess levelLayers;
  TextureFormat local_40;
  ChannelOrder local_38 [6];
  TextureFormat local_20;
  
  pTVar1 = (TextureFormat *)
           ((this->m_texture).super_TextureLevelPyramid.m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_start + level);
  local_40 = *pTVar1;
  lVar3 = 2;
  do {
    local_38[lVar3 + -2] = (&pTVar1->order)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 5;
  do {
    local_38[lVar3 + -2] = (&pTVar1->order)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  local_20 = pTVar1[4];
  iVar4 = layer * local_38[0] * local_38[1];
  iVar2 = tcu::TextureFormat::getPixelSize(&local_40);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&local_40,local_38[0],local_38[1],1,
             (void *)((ulong)(uint)(iVar4 * iVar2) + (long)local_20));
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCubeArray::getLevel (int level, int layer)
{
	const tcu::PixelBufferAccess	levelLayers	= m_texture.getLevel(level);
	const deUint32					layerSize	= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();
	const deUint32					layerOffset	= layerSize * layer;

	return tcu::PixelBufferAccess(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
}